

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockets.cpp
# Opt level: O3

bool SendInt(int socket,int number)

{
  ssize_t sVar1;
  size_t __n;
  
  __n = 4;
  do {
    sVar1 = write(socket,&stack0xffffffffffffffe8 + -__n,__n);
    __n = __n - sVar1;
    if (__n == 0) break;
  } while (0 < sVar1);
  return 0 < sVar1;
}

Assistant:

bool SendInt(int socket, int number)
{
    char * data = (char*)&number;
    size_t left = sizeof(number);
    ssize_t rc;

    while (left)
    {
        rc = write(socket, data + sizeof(number) - left, left);
        if(rc <= 0) return false;
        left -= rc;
    }

    return true;
}